

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O0

void __thiscall multiple_locations_one_option::test_method(multiple_locations_one_option *this)

{
  undefined8 uVar1;
  bool bVar2;
  pointer poVar3;
  vw_exception *ex;
  option_group_definition arg_group;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_> options;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  int argc;
  char command_line [20];
  string str_opt_2;
  string str_opt_1;
  pointer in_stack_fffffffffffffc08;
  undefined1 pv_;
  undefined4 in_stack_fffffffffffffc10;
  undefined2 in_stack_fffffffffffffc14;
  undefined1 in_stack_fffffffffffffc16;
  undefined1 in_stack_fffffffffffffc17;
  string *in_stack_fffffffffffffc18;
  unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
  *in_stack_fffffffffffffc20;
  char **in_stack_fffffffffffffc50;
  allocator *paVar4;
  undefined8 in_stack_fffffffffffffc58;
  int argc_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *op
  ;
  options_boost_po *in_stack_fffffffffffffc60;
  option_group_definition *this_00;
  basic_cstring<const_char> local_310;
  undefined1 local_300 [32];
  undefined1 local_2e0 [24];
  undefined1 local_2c8 [16];
  basic_cstring<const_char> local_2b8;
  undefined1 local_2a8 [16];
  basic_cstring<const_char> local_298;
  allocator local_281;
  string local_280 [199];
  allocator local_1b9;
  string local_1b8 [199];
  undefined1 local_f1 [33];
  undefined1 local_d0 [56];
  undefined1 local_98 [104];
  string local_30 [48];
  
  argc_00 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string((string *)(local_98 + 0x48));
  local_98[0x30] = 'e';
  local_98[0x31] = 'x';
  local_98[0x32] = 'e';
  local_98[0x33] = ' ';
  local_98[0x34] = '-';
  local_98[0x35] = '-';
  local_98[0x36] = 's';
  local_98[0x37] = 't';
  local_98[0x38] = 'r';
  local_98[0x39] = '_';
  local_98[0x3a] = 'o';
  local_98[0x3b] = 'p';
  local_98[0x3c] = 't';
  local_98[0x3d] = ' ';
  local_98[0x3e] = 'v';
  local_98[0x3f] = 'a';
  local_98._64_4_ = 0x65756c;
  convert_to_command_args
            ((char *)in_stack_fffffffffffffc20,(int *)in_stack_fffffffffffffc18,
             CONCAT13(in_stack_fffffffffffffc17,
                      CONCAT12(in_stack_fffffffffffffc16,in_stack_fffffffffffffc14)));
  std::unique_ptr<char*,std::default_delete<char*>>::unique_ptr<std::default_delete<char*>,void>
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
             (pointer)in_stack_fffffffffffffc08);
  operator_new(0x2e8);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::get
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
  VW::config::options_boost_po::options_boost_po
            (in_stack_fffffffffffffc60,argc_00,in_stack_fffffffffffffc50);
  op = (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)local_98;
  std::unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>>::
  unique_ptr<std::default_delete<VW::config::options_boost_po>,void>
            ((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)CONCAT17(in_stack_fffffffffffffc17,
                         CONCAT16(in_stack_fffffffffffffc16,
                                  CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
             in_stack_fffffffffffffc08);
  std::unique_ptr<VW::config::options_i,std::default_delete<VW::config::options_i>>::
  unique_ptr<VW::config::options_boost_po,std::default_delete<VW::config::options_boost_po>,void>
            (in_stack_fffffffffffffc20,
             (unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
              *)in_stack_fffffffffffffc18);
  std::unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
  ::~unique_ptr((unique_ptr<VW::config::options_boost_po,_std::default_delete<VW::config::options_boost_po>_>
                 *)CONCAT17(in_stack_fffffffffffffc17,
                            CONCAT16(in_stack_fffffffffffffc16,
                                     CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)))
               );
  this_00 = (option_group_definition *)local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_f1 + 1),"group",(allocator *)this_00);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
             (string *)in_stack_fffffffffffffc08);
  std::__cxx11::string::~string((string *)(local_f1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  paVar4 = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"str_opt",paVar4);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffc18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
  VW::config::option_group_definition::add<std::__cxx11::string>(this_00,op);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc17,
                            CONCAT16(in_stack_fffffffffffffc16,
                                     CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)))
               );
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"str_opt",&local_281);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffffc18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
  VW::config::option_group_definition::add<std::__cxx11::string>(this_00,op);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc17,
                            CONCAT16(in_stack_fffffffffffffc16,
                                     CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)))
               );
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
               ,0x76);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc17,
                        CONCAT16(in_stack_fffffffffffffc16,
                                 CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_298,0x94,local_2a8);
    poVar3 = std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::
             operator->((unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>
                         *)0x12f20b);
    (**poVar3->_vptr_options_i)(poVar3,local_d0);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      pv_ = (undefined1)((ulong)in_stack_fffffffffffffc08 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x76);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2b8,0x94,local_2c8);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))),
                 (bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffc18,
                 (char (*) [51])
                 CONCAT17(in_stack_fffffffffffffc17,
                          CONCAT16(in_stack_fffffffffffffc16,
                                   CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_310,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
                 ,0x76);
      in_stack_fffffffffffffc08 = (pointer)0x0;
      boost::test_tools::tt_detail::report_assertion(local_2e0,local_300,&local_310,0x94,1);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[51],_const_char_(&)[51]>
                          *)0x12f312);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x12f31f);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    in_stack_fffffffffffffc16 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc16);
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
  std::unique_ptr<VW::config::options_i,_std::default_delete<VW::config::options_i>_>::~unique_ptr
            (in_stack_fffffffffffffc20);
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr
            ((unique_ptr<char_*,_std::default_delete<char_*>_> *)
             CONCAT17(in_stack_fffffffffffffc17,
                      CONCAT16(in_stack_fffffffffffffc16,
                               CONCAT24(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10))));
  std::__cxx11::string::~string((string *)(local_98 + 0x48));
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(multiple_locations_one_option) {
  std::string str_opt_1;
  std::string str_opt_2;

  char command_line[] = "exe --str_opt value";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("str_opt", str_opt_1));
  arg_group.add(make_option("str_opt", str_opt_2));

  BOOST_CHECK_THROW(options->add_and_parse(arg_group), VW::vw_exception);
}